

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_moveable.hpp
# Opt level: O0

stack<int,_std::deque<int,_std::allocator<int>_>_> *
cpp_bindgen::any_cast<std::stack<int,std::deque<int,std::allocator<int>>>const>(any_moveable *src)

{
  bool bVar1;
  type_info *this;
  pointer piVar2;
  any_moveable *src_local;
  
  if (src != (any_moveable *)0x0) {
    this = any_moveable::type(src);
    bVar1 = std::type_info::operator==
                      (this,(type_info *)
                            &std::stack<int,std::deque<int,std::allocator<int>>>::typeinfo);
    if (bVar1) {
      piVar2 = std::
               unique_ptr<cpp_bindgen::any_moveable::iface,_std::default_delete<cpp_bindgen::any_moveable::iface>_>
               ::get(&src->m_impl);
      return (stack<int,_std::deque<int,_std::allocator<int>_>_> *)(piVar2 + 1);
    }
  }
  return (stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x0;
}

Assistant:

T *any_cast(any_moveable *src) noexcept {
            return src && src->type() == typeid(T) ? &static_cast<impl<T> *>(src->m_impl.get())->m_obj : nullptr;
        }